

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdAddConfidentialTxOut
              (void *handle,char *tx_hex_string,char *asset_string,int64_t value_satoshi,
              char *value_commitment,char *address,char *direct_locking_script,char *nonce,
              char **tx_string)

{
  undefined **ppuVar1;
  bool bVar2;
  char *pcVar3;
  CfdException *pCVar4;
  Amount AVar5;
  ConfidentialAssetId asset_obj;
  ConfidentialNonce nonce_obj;
  ConfidentialValue value;
  ElementsAddressFactory address_factory;
  ConfidentialTransactionContext ctxc;
  allocator local_361;
  Amount local_360;
  void *local_350;
  Script local_348;
  ConfidentialAssetId local_310;
  ConfidentialNonce local_2e8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  pointer local_290;
  pointer local_278;
  pointer local_260;
  TapBranch local_248;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1d0;
  Script local_1b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178 [2];
  AddressFactory local_110;
  ConfidentialTransactionContext local_e8;
  
  local_350 = handle;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar2) {
    local_2c0._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_2c0._8_4_ = 0xf5;
    local_2c0._16_8_ = "CfdAddConfidentialTxOut";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_2c0,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2c0._0_8_ = local_2c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c0,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_2c0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string != (char **)0x0) {
    bVar2 = cfd::capi::IsEmptyString(asset_string);
    if (!bVar2) {
      std::__cxx11::string::string((string *)local_2c0,tx_hex_string,(allocator *)&local_348);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (&local_e8,(string *)local_2c0);
      ppuVar1 = (undefined **)(local_2c0 + 0x10);
      if ((undefined **)local_2c0._0_8_ != ppuVar1) {
        operator_delete((void *)local_2c0._0_8_);
      }
      cfd::core::Amount::Amount(&local_360);
      bVar2 = cfd::capi::IsEmptyString(value_commitment);
      if (bVar2) {
        AVar5 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
        local_360.amount_ = AVar5.amount_;
        local_360.ignore_check_ = AVar5.ignore_check_;
      }
      else {
        std::__cxx11::string::string((string *)&local_348,value_commitment,(allocator *)&local_110);
        cfd::core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)local_2c0,(string *)&local_348);
        if (local_348._vptr_Script !=
            (_func_int **)
            ((long)&local_348.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8U)) {
          operator_delete(local_348._vptr_Script);
        }
        bVar2 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_2c0);
        if (!bVar2) {
          AVar5 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)local_2c0);
          local_360.amount_ = AVar5.amount_;
          local_360.ignore_check_ = AVar5.ignore_check_;
        }
        local_2c0._0_8_ = &PTR__ConfidentialValue_00723840;
        if ((void *)CONCAT44(local_2c0._12_4_,local_2c0._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_2c0._12_4_,local_2c0._8_4_));
        }
      }
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_110);
      std::__cxx11::string::string((string *)local_2c0,asset_string,(allocator *)&local_348);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_310,(string *)local_2c0);
      if ((undefined **)local_2c0._0_8_ != ppuVar1) {
        operator_delete((void *)local_2c0._0_8_);
      }
      cfd::core::ConfidentialNonce::ConfidentialNonce(&local_2e8);
      bVar2 = cfd::capi::IsEmptyString(nonce);
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_348,nonce,&local_361);
        cfd::core::ConfidentialNonce::ConfidentialNonce
                  ((ConfidentialNonce *)local_2c0,(string *)&local_348);
        cfd::core::ConfidentialNonce::operator=(&local_2e8,(ConfidentialNonce *)local_2c0);
        local_2c0._0_8_ = &PTR__ConfidentialNonce_00723710;
        if ((void *)CONCAT44(local_2c0._12_4_,local_2c0._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_2c0._12_4_,local_2c0._8_4_));
        }
        if (local_348._vptr_Script !=
            (_func_int **)
            ((long)&local_348.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8U)) {
          operator_delete(local_348._vptr_Script);
        }
      }
      bVar2 = cfd::capi::IsEmptyString(address);
      if (bVar2) {
        bVar2 = cfd::capi::IsEmptyString(direct_locking_script);
        if (bVar2) {
          bVar2 = cfd::core::operator>(&local_360,0);
          if (bVar2) {
            cfd::ConfidentialTransactionContext::UpdateFeeAmount(&local_e8,&local_360,&local_310);
          }
        }
        else {
          std::__cxx11::string::string((string *)&local_348,direct_locking_script,&local_361);
          cfd::core::Script::Script((Script *)local_2c0,(string *)&local_348);
          if (local_348._vptr_Script !=
              (_func_int **)
              ((long)&local_348.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 8U)) {
            operator_delete(local_348._vptr_Script);
          }
          cfd::core::ConfidentialTransaction::AddTxOut
                    (&local_e8.super_ConfidentialTransaction,&local_360,&local_310,
                     (Script *)local_2c0,&local_2e8);
          cfd::core::Script::~Script((Script *)local_2c0);
        }
      }
      else {
        std::__cxx11::string::string((string *)local_2c0,address,(allocator *)&local_348);
        bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)local_2c0);
        if ((undefined **)local_2c0._0_8_ != ppuVar1) {
          operator_delete((void *)local_2c0._0_8_);
        }
        if (bVar2) {
          std::__cxx11::string::string((string *)&local_348,address,&local_361);
          cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                    ((ElementsConfidentialAddress *)local_2c0,(string *)&local_348);
          if (local_348._vptr_Script !=
              (_func_int **)
              ((long)&local_348.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 8U)) {
            operator_delete(local_348._vptr_Script);
          }
          cfd::ConfidentialTransactionContext::AddTxOut
                    (&local_e8,(ElementsConfidentialAddress *)local_2c0,&local_360,&local_310,false)
          ;
          cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                    ((ElementsConfidentialAddress *)local_2c0);
        }
        else {
          std::__cxx11::string::string((string *)&local_348,address,&local_361);
          cfd::AddressFactory::GetAddress((Address *)local_2c0,&local_110,(string *)&local_348);
          if (local_348._vptr_Script !=
              (_func_int **)
              ((long)&local_348.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 8U)) {
            operator_delete(local_348._vptr_Script);
          }
          cfd::core::Address::GetLockingScript(&local_348,(Address *)local_2c0);
          cfd::core::ConfidentialTransaction::AddTxOut
                    (&local_e8.super_ConfidentialTransaction,&local_360,&local_310,&local_348,
                     &local_2e8);
          cfd::core::Script::~Script(&local_348);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_178);
          cfd::core::Script::~Script(&local_1b8);
          local_248._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&local_1d0);
          cfd::core::TapBranch::~TapBranch(&local_248);
          if (local_260 != (pointer)0x0) {
            operator_delete(local_260);
          }
          if (local_278 != (pointer)0x0) {
            operator_delete(local_278);
          }
          if (local_290 != (pointer)0x0) {
            operator_delete(local_290);
          }
          if ((undefined1 *)local_2c0._16_8_ != local_2a0) {
            operator_delete((void *)local_2c0._16_8_);
          }
        }
      }
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)local_2c0,(AbstractTransaction *)&local_e8);
      pcVar3 = cfd::capi::CreateString((string *)local_2c0);
      *tx_string = pcVar3;
      if ((undefined **)local_2c0._0_8_ != ppuVar1) {
        operator_delete((void *)local_2c0._0_8_);
      }
      local_2e8._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
      if (local_2e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_310._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
      if (local_310.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_110._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_110.prefix_list_);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_e8);
      return 0;
    }
    local_2c0._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_2c0._8_4_ = 0x101;
    local_2c0._16_8_ = "CfdAddConfidentialTxOut";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_2c0,kCfdLogLevelWarning,"asset is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2c0._0_8_ = local_2c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c0,"Failed to parameter. asset is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_2c0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_2c0._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_2c0._8_4_ = 0xfb;
  local_2c0._16_8_ = "CfdAddConfidentialTxOut";
  cfd::core::logger::log<>((CfdSourceLocation *)local_2c0,kCfdLogLevelWarning,"tx output is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_2c0._0_8_ = local_2c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,"Failed to parameter. tx output is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_2c0);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddConfidentialTxOut(
    void* handle, const char* tx_hex_string, const char* asset_string,
    int64_t value_satoshi, const char* value_commitment, const char* address,
    const char* direct_locking_script, const char* nonce, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }

    ConfidentialTransactionContext ctxc(tx_hex_string);

    Amount amount;
    if (IsEmptyString(value_commitment)) {
      amount = Amount::CreateBySatoshiAmount(value_satoshi);
    } else {
      ConfidentialValue value = ConfidentialValue(value_commitment);
      // unconfidential only
      if (!value.HasBlinding()) amount = value.GetAmount();
    }

    // add TxOut
    ElementsAddressFactory address_factory;
    ConfidentialAssetId asset_obj(asset_string);
    ConfidentialNonce nonce_obj;
    if (!IsEmptyString(nonce)) {
      nonce_obj = ConfidentialNonce(nonce);
    }
    if (!IsEmptyString(address)) {
      // const std::string addr(address);
      if (ElementsConfidentialAddress::IsConfidentialAddress(address)) {
        ElementsConfidentialAddress confidential_addr(address);
        ctxc.AddTxOut(confidential_addr, amount, asset_obj, false);
      } else {
        Address addr = address_factory.GetAddress(address);
        ctxc.AddTxOut(amount, asset_obj, addr.GetLockingScript(), nonce_obj);
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      Script script(direct_locking_script);
      ctxc.AddTxOut(amount, asset_obj, script, nonce_obj);
    } else if (amount > 0) {
      // fee
      ctxc.UpdateFeeAmount(amount, asset_obj);
    }

    *tx_string = CreateString(ctxc.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}